

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfHeaderSetIntAttribute(ImfHeader *hdr,char *name,int value)

{
  undefined1 uVar1;
  TypedAttribute<int> *this;
  int *piVar2;
  int in_EDX;
  ImfHeader *in_RDI;
  char *in_stack_00000040;
  Header *in_stack_00000048;
  exception *e;
  Attribute *in_stack_00000520;
  char *in_stack_00000528;
  Header *in_stack_00000530;
  Header *in_stack_ffffffffffffff38;
  TypedAttribute<int> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  
  anon_unknown.dwarf_70604::header(in_RDI);
  Imf_3_4::Header::find(in_stack_00000048,in_stack_00000040);
  Imf_3_4::Header::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_ffffffffffffff40,(Iterator *)in_stack_ffffffffffffff38);
  anon_unknown.dwarf_70604::header(in_RDI);
  Imf_3_4::Header::end(in_stack_ffffffffffffff38);
  Imf_3_4::Header::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_ffffffffffffff40,(Iterator *)in_stack_ffffffffffffff38);
  uVar1 = Imf_3_4::operator==((ConstIterator *)in_stack_ffffffffffffff40,
                              (ConstIterator *)in_stack_ffffffffffffff38);
  if ((bool)uVar1) {
    anon_unknown.dwarf_70604::header(in_RDI);
    Imf_3_4::TypedAttribute<int>::TypedAttribute
              (in_stack_ffffffffffffff40,(int *)in_stack_ffffffffffffff38);
    Imf_3_4::Header::insert(in_stack_00000530,in_stack_00000528,in_stack_00000520);
    Imf_3_4::TypedAttribute<int>::~TypedAttribute((TypedAttribute<int> *)0x19b22f);
  }
  else {
    anon_unknown.dwarf_70604::header(in_RDI);
    this = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<int>>
                     ((Header *)CONCAT17(uVar1,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68)
    ;
    piVar2 = Imf_3_4::TypedAttribute<int>::value(this);
    *piVar2 = in_EDX;
  }
  return 1;
}

Assistant:

int
ImfHeaderSetIntAttribute (ImfHeader* hdr, const char name[], int value)
{
    try
    {
        if (header (hdr)->find (name) == header (hdr)->end ())
        {
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::IntAttribute (value));
        }
        else
        {
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::IntAttribute> (
                    name)
                .value () = value;
        }

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}